

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui-ext.cpp
# Opt level: O1

void igSetWindowSizeVec2(ImVec2 size,ImGuiCond cond)

{
  ImVec2 local_8;
  
  local_8 = size;
  ImGui::SetWindowSize(&local_8,cond);
  return;
}

Assistant:

CIMGUI_API void _igSetWindowSizeVec2 (ImVec2 const *larg1, ImGuiCond *larg2) {
  ImVec2 arg1 ;
  ImGuiCond arg2 ;
  
  arg1 = *larg1;
  arg2 = *larg2;
  try {
    igSetWindowSizeVec2(arg1,arg2);
    
  } catch (...) {
    
  }
}